

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotionImposed.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMotionImposed::ChLinkMotionImposed(ChLinkMotionImposed *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 local_39;
  undefined1 local_38 [16];
  double dStack_28;
  double local_20;
  
  ChLinkMateGeneric::ChLinkMateGeneric(&this->super_ChLinkMateGeneric,true,true,true,true,true,true)
  ;
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkMotionImposed_00b48150;
  (this->position_function).
  super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->position_function).
  super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->rotation_function).
  super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->rotation_function).
  super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._0_8_ = (ChFunctionRotation_ABCfunctions *)0x3ff0000000000000;
  register0x00001200 = ZEXT416(0) << 0x40;
  local_20 = 0.0;
  (this->frameM2)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  *(undefined1 (*) [16])(this->frameM2).coord.pos.m_data = register0x00001200;
  (this->frameM2).coord.pos.m_data[2] = 0.0;
  (this->frameM2).coord.rot.m_data[0] = 1.0;
  *(undefined1 (*) [16])((this->frameM2).coord.rot.m_data + 1) = register0x00001200;
  (this->frameM2).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->frameM2).Amatrix,(ChQuaternion<double> *)local_38);
  local_38._0_8_ = (ChFunctionRotation_ABCfunctions *)0x3ff0000000000000;
  stack0xffffffffffffffd0 = ZEXT816(0);
  local_20 = 0.0;
  (this->frameMb2)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->frameMb2).coord.pos.m_data[0] = 0.0;
  (this->frameMb2).coord.pos.m_data[1] = 0.0;
  (this->frameMb2).coord.pos.m_data[2] = 0.0;
  (this->frameMb2).coord.rot.m_data[0] = 1.0;
  (this->frameMb2).coord.rot.m_data[1] = 0.0;
  (this->frameMb2).coord.rot.m_data[2] = 0.0;
  (this->frameMb2).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->frameMb2).Amatrix,(ChQuaternion<double> *)local_38);
  local_38._0_8_ = (ChFunctionRotation_ABCfunctions *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChFunctionPosition_XYZfunctions,std::allocator<chrono::ChFunctionPosition_XYZfunctions>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8),
             (ChFunctionPosition_XYZfunctions **)local_38,
             (allocator<chrono::ChFunctionPosition_XYZfunctions> *)&local_39);
  uVar4 = local_38._0_8_;
  uVar5 = local_38._8_8_;
  local_38._0_8_ = (ChFunctionRotation_ABCfunctions *)0x0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dStack_28;
  stack0xffffffffffffffd0 = auVar2 << 0x40;
  p_Var1 = (this->position_function).
           super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->position_function).
  super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->position_function).
  super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  local_38._0_8_ = (ChFunctionRotation_ABCfunctions *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChFunctionRotation_ABCfunctions,std::allocator<chrono::ChFunctionRotation_ABCfunctions>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8),
             (ChFunctionRotation_ABCfunctions **)local_38,
             (allocator<chrono::ChFunctionRotation_ABCfunctions> *)&local_39);
  uVar4 = local_38._0_8_;
  uVar5 = local_38._8_8_;
  local_38._0_8_ = (ChFunctionRotation_ABCfunctions *)0x0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dStack_28;
  stack0xffffffffffffffd0 = auVar3 << 0x40;
  p_Var1 = (this->rotation_function).
           super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->rotation_function).
  super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->rotation_function).
  super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  return;
}

Assistant:

ChLinkMotionImposed::ChLinkMotionImposed() : ChLinkMateGeneric(true, true, true, true, true, true) {
    // default motion and rotation: no rotation no translation
	position_function = chrono_types::make_shared<ChFunctionPosition_XYZfunctions>();
	rotation_function = chrono_types::make_shared<ChFunctionRotation_ABCfunctions>();
}